

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O2

WriterData * __thiscall
SafeQueue<WriterData>::pop(WriterData *__return_storage_ptr__,SafeQueue<WriterData> *this)

{
  _Elt_pointer pWVar1;
  uint8_t *puVar2;
  Commands CVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  
  std::mutex::lock(&this->m_mtx);
  pWVar1 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  puVar2 = pWVar1->m_buffer;
  iVar5 = pWVar1->m_bufferLen;
  uVar6 = *(undefined4 *)&pWVar1->field_0xc;
  CVar3 = pWVar1->m_command;
  uVar4 = *(undefined4 *)&pWVar1->field_0x1c;
  __return_storage_ptr__->m_mainFile = pWVar1->m_mainFile;
  __return_storage_ptr__->m_command = CVar3;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
  __return_storage_ptr__->m_buffer = puVar2;
  __return_storage_ptr__->m_bufferLen = iVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar6;
  std::deque<WriterData,_std::allocator<WriterData>_>::pop_front(&(this->m_queue).c);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
  return __return_storage_ptr__;
}

Assistant:

virtual T pop()
    {
        std::lock_guard lk(m_mtx);

        T val = m_queue.front();
        m_queue.pop();

        return val;
    }